

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

string * __thiscall
sc_core::sc_trace_file_base::fs_unit_to_str_abi_cxx11_
          (string *__return_storage_ptr__,sc_trace_file_base *this,unit_type tu)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_1b8 [4];
  stringstream ss;
  ostream local_188 [376];
  
  if (this == (sc_trace_file_base *)0x16345785d8a0000) {
    pcVar2 = "100 sec";
  }
  else if (this == (sc_trace_file_base *)0xa) {
    pcVar2 = "10 fs";
  }
  else if (this == (sc_trace_file_base *)0x64) {
    pcVar2 = "100 fs";
  }
  else if (this == (sc_trace_file_base *)0x3e8) {
    pcVar2 = "1 ps";
  }
  else if (this == (sc_trace_file_base *)0x2710) {
    pcVar2 = "10 ps";
  }
  else if (this == (sc_trace_file_base *)0x186a0) {
    pcVar2 = "100 ps";
  }
  else if (this == (sc_trace_file_base *)0xf4240) {
    pcVar2 = "1 ns";
  }
  else if (this == (sc_trace_file_base *)0x989680) {
    pcVar2 = "10 ns";
  }
  else if (this == (sc_trace_file_base *)0x5f5e100) {
    pcVar2 = "100 ns";
  }
  else if (this == (sc_trace_file_base *)0x3b9aca00) {
    pcVar2 = "1 us";
  }
  else if (this == (sc_trace_file_base *)0x2540be400) {
    pcVar2 = "10 us";
  }
  else if (this == (sc_trace_file_base *)0x174876e800) {
    pcVar2 = "100 us";
  }
  else if (this == (sc_trace_file_base *)0xe8d4a51000) {
    pcVar2 = "1 ms";
  }
  else if (this == (sc_trace_file_base *)0x9184e72a000) {
    pcVar2 = "10 ms";
  }
  else if (this == (sc_trace_file_base *)0x5af3107a4000) {
    pcVar2 = "100 ms";
  }
  else if (this == (sc_trace_file_base *)0x38d7ea4c68000) {
    pcVar2 = "1 sec";
  }
  else if (this == (sc_trace_file_base *)0x2386f26fc10000) {
    pcVar2 = "10 sec";
  }
  else {
    if (this != (sc_trace_file_base *)0x1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_188,"not a power of ten: ");
      poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
      std::operator<<(poVar1," fs");
      std::__cxx11::stringbuf::str();
      sc_report_handler::report
                (SC_ERROR,"invalid tracing timescale unit set",local_1b8[0],
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
                 ,0x14d);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    pcVar2 = "1 fs";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string
sc_trace_file_base::fs_unit_to_str(sc_trace_file_base::unit_type tu)
{
    switch (tu)
    {
        case UINT64_C(1): return "1 fs";
        case UINT64_C(10): return "10 fs";
        case UINT64_C(100): return "100 fs";
        case UINT64_C(1000): return "1 ps";
        case UINT64_C(10000): return "10 ps";
        case UINT64_C(100000): return "100 ps";
        case UINT64_C(1000000): return "1 ns";
        case UINT64_C(10000000): return "10 ns";
        case UINT64_C(100000000): return "100 ns";
        case UINT64_C(1000000000): return "1 us";
        case UINT64_C(10000000000): return "10 us";
        case UINT64_C(100000000000): return "100 us";
        case UINT64_C(1000000000000): return "1 ms";
        case UINT64_C(10000000000000): return "10 ms";
        case UINT64_C(100000000000000): return "100 ms";
        case UINT64_C(1000000000000000): return "1 sec";
        case UINT64_C(10000000000000000): return "10 sec";
        case UINT64_C(100000000000000000): return "100 sec";
        default: /* fail below */ (void)0;
    }

    std::stringstream ss;
    ss << "not a power of ten: " << tu << " fs";
    SC_REPORT_ERROR( SC_ID_TRACING_INVALID_TIMESCALE_UNIT_,
                     ss.str().c_str() );
    return "";
}